

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void __thiscall Logger::printError(Logger *this,ErrorType type,string_view text)

{
  const_pointer pvVar1;
  char *text_00;
  undefined4 in_register_00000034;
  undefined1 auVar2 [16];
  string_view text_01;
  undefined1 local_40 [8];
  string errorText;
  undefined1 auStack_18 [4];
  ErrorType type_local;
  string_view text_local;
  
  _auStack_18 = CONCAT44(in_register_00000034,type);
  text_00 = text._M_str;
  text_local._M_len = text._M_len;
  errorText.field_2._12_4_ = SUB84(this,0);
  if (suppressLevel == 0) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
    formatError_abi_cxx11_
              ((string *)local_40,(Logger *)((ulong)this & 0xffffffff),(ErrorType)pvVar1,text_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&errors_abi_cxx11_,(string *)local_40);
    if ((silent & 1U) == 0) {
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      text_01._M_str = auVar2._8_8_;
      text_01._M_len = (size_t)text_01._M_str;
      printLine(auVar2._0_8_,text_01);
    }
    setFlags(errorText.field_2._12_4_);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void Logger::printError(ErrorType type, const std::string_view text)
{
	if (suppressLevel)
		return;

	std::string errorText = formatError(type,text.data());
	errors.push_back(errorText);

	if (!silent)
		printLine(errorText);

	setFlags(type);
}